

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWrd.h
# Opt level: O2

void Vec_WrdGrow(Vec_Wrd_t *p,int nCapMin)

{
  word *pwVar1;
  
  if (p->nCap < nCapMin) {
    if (p->pArray == (word *)0x0) {
      pwVar1 = (word *)malloc((ulong)(uint)nCapMin << 3);
    }
    else {
      pwVar1 = (word *)realloc(p->pArray,(ulong)(uint)nCapMin << 3);
    }
    p->pArray = pwVar1;
    if (pwVar1 == (word *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWrd.h"
                    ,0x1e4,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
    }
    p->nCap = nCapMin;
  }
  return;
}

Assistant:

static inline void Vec_WrdGrow( Vec_Wrd_t * p, int nCapMin )
{
    if ( p->nCap >= nCapMin )
        return;
    p->pArray = ABC_REALLOC( word, p->pArray, nCapMin ); 
    assert( p->pArray );
    p->nCap   = nCapMin;
}